

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2Dgridsearch.cpp
# Opt level: O1

uchar getCostT<4>(uchar **Grid2D,int x,int y,int param_4)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  int dx;
  long lVar4;
  
  bVar2 = Grid2D[x << 2][(long)y * 4];
  uVar3 = 0;
  do {
    lVar4 = 0;
    do {
      bVar1 = (Grid2D + (x << 2))[lVar4][uVar3 | (long)(int)((long)y << 2)];
      if (bVar1 < bVar2) {
        bVar1 = bVar2;
      }
      bVar2 = bVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 4);
  return bVar2;
}

Assistant:

unsigned char getCostT(unsigned char **Grid2D, int x, int y, int /*resample*/)
{
    if(N == 1) // the compiler will optimize out this if statement
    {
        return Grid2D[x][y];
    }
    else
    {
        x *= N;
        y *= N;
        unsigned char maximum = Grid2D[x][y];
        for(int dy=0; dy<N; dy++)
            for(int dx=0; dx<N; dx++)
                maximum = __max(maximum, Grid2D[x+dx][y+dy]);

        return maximum;
    }
}